

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * inline_suboperations(Query *q,bool *changed)

{
  bool bVar1;
  QueryType *pQVar2;
  Query *this;
  Query *other;
  undefined1 *in_RDX;
  Query *in_RSI;
  Query *in_RDI;
  Query *subquery;
  iterator __end3;
  iterator __begin3;
  vector<Query,_std::allocator<Query>_> *__range3;
  Query *query;
  iterator __end1;
  iterator __begin1;
  vector<Query,_std::allocator<Query>_> *__range1;
  vector<Query,_std::allocator<Query>_> newqueries;
  Query *in_stack_fffffffffffffef8;
  Query *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  QueryType QVar3;
  Query *in_stack_ffffffffffffff10;
  QueryType *in_stack_ffffffffffffff18;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_70;
  Query *local_68;
  reference local_60;
  Query *local_58;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_50 [3];
  Query *local_38;
  undefined1 *local_18;
  Query *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pQVar2 = Query::get_type(in_RSI);
  if ((*pQVar2 != AND) && (pQVar2 = Query::get_type(local_10), *pQVar2 != OR)) {
    Query::Query(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    return in_RDI;
  }
  std::vector<Query,_std::allocator<Query>_>::vector
            ((vector<Query,_std::allocator<Query>_> *)0x1e8d44);
  this = (Query *)Query::as_queries(in_stack_ffffffffffffff10);
  local_38 = this;
  local_50[0]._M_current =
       (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffef8);
  local_58 = (Query *)std::vector<Query,_std::allocator<Query>_>::end
                                ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef8)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    local_60 = __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
               operator*(local_50);
    in_stack_ffffffffffffff18 = Query::get_type(local_60);
    QVar3 = *in_stack_ffffffffffffff18;
    in_stack_ffffffffffffff10 = (Query *)Query::get_type(local_10);
    if (QVar3 == in_stack_ffffffffffffff10->type) {
      in_stack_ffffffffffffff00 = (Query *)Query::as_queries(in_stack_ffffffffffffff10);
      local_68 = in_stack_ffffffffffffff00;
      local_70._M_current =
           (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffef8);
      std::vector<Query,_std::allocator<Query>_>::end
                ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                 *)in_stack_ffffffffffffff00,
                                (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                 *)in_stack_fffffffffffffef8), bVar1) {
        __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
        operator*(&local_70);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  ((vector<Query,_std::allocator<Query>_> *)in_stack_ffffffffffffff10,
                   (Query *)CONCAT44(QVar3,in_stack_ffffffffffffff08));
        __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
        operator++(&local_70);
      }
      *local_18 = 1;
    }
    else {
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                ((vector<Query,_std::allocator<Query>_> *)in_stack_ffffffffffffff10,
                 (Query *)CONCAT44(QVar3,in_stack_ffffffffffffff08));
    }
    __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::operator++
              (local_50);
  }
  other = (Query *)Query::get_type(local_10);
  Query::Query(this,in_stack_ffffffffffffff18,
               (vector<Query,_std::allocator<Query>_> *)in_stack_ffffffffffffff10);
  Query::Query(in_stack_ffffffffffffff00,other);
  Query::~Query(in_stack_ffffffffffffff00);
  std::vector<Query,_std::allocator<Query>_>::~vector
            ((vector<Query,_std::allocator<Query>_> *)in_stack_ffffffffffffff10);
  return in_RDI;
}

Assistant:

Query inline_suboperations(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() == q.get_type()) {
            for (auto &&subquery : query.as_queries()) {
                newqueries.emplace_back(std::move(subquery));
            }
            *changed = true;
        } else {
            newqueries.emplace_back(std::move(query));
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}